

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_b4;
  int n1;
  int last;
  int top;
  lua_Debug ar;
  int level_local;
  char *msg_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  ar.i_ci._4_4_ = level;
  iVar1 = lua_gettop(L);
  iVar2 = lastlevel(L1);
  local_b4 = -1;
  if (0x15 < iVar2 - ar.i_ci._4_4_) {
    local_b4 = 10;
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n",msg);
  }
  luaL_checkstack(L,10,(char *)0x0);
  lua_pushstring(L,"stack traceback:");
  while( true ) {
    iVar3 = ar.i_ci._4_4_;
    ar.i_ci._4_4_ = ar.i_ci._4_4_ + 1;
    iVar3 = lua_getstack(L1,iVar3,(lua_Debug *)&last);
    if (iVar3 == 0) break;
    if (local_b4 == 0) {
      lua_pushstring(L,"\n\t...");
      ar.i_ci._4_4_ = iVar2 + -10;
      local_b4 = local_b4 + -1;
    }
    else {
      lua_getinfo(L1,"Slnt",(lua_Debug *)&last);
      lua_pushfstring(L,"\n\t%s:",&ar.lastlinedefined);
      if (0 < (int)(uint)ar.source) {
        lua_pushfstring(L,"%d:",(ulong)(uint)ar.source);
      }
      lua_pushstring(L," in ");
      pushfuncname(L,(lua_Debug *)&last);
      if (ar.linedefined._3_1_ != '\0') {
        lua_pushstring(L,"\n\t(...tail calls...)");
      }
      iVar3 = lua_gettop(L);
      lua_concat(L,iVar3 - iVar1);
      local_b4 = local_b4 + -1;
    }
  }
  iVar2 = lua_gettop(L);
  lua_concat(L,iVar2 - iVar1);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int last = lastlevel(L1);
  int n1 = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  if (msg)
    lua_pushfstring(L, "%s\n", msg);
  luaL_checkstack(L, 10, NULL);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (n1-- == 0) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = last - LEVELS2 + 1;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}